

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyBlobSearch(void *pBlob,sxu32 nLen,void *pPattern,sxu32 pLen,sxu32 *pOfft)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  void *pvVar5;
  char *zIn;
  void *pvVar6;
  int iVar7;
  char cVar8;
  long lVar9;
  void *pvVar10;
  
  if (pLen <= nLen) {
    pvVar5 = (void *)((ulong)(nLen - pLen) + (long)pBlob);
    iVar1 = pLen - 1;
    iVar2 = pLen - 2;
    iVar3 = pLen - 3;
    pvVar6 = pBlob;
    do {
      pvVar10 = pBlob;
      if (pLen == 0) {
LAB_00135496:
        if (pOfft != (sxu32 *)0x0) {
          *pOfft = (int)pvVar10 - (int)pBlob;
        }
        return 0;
      }
      lVar9 = 0;
      while( true ) {
        cVar4 = *(char *)((long)pvVar6 + lVar9);
        cVar8 = *(char *)((long)pPattern + lVar9);
        pvVar10 = pvVar6;
        if (cVar4 != cVar8) break;
        iVar7 = (int)lVar9;
        if (iVar1 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 1);
        cVar8 = *(char *)((long)pPattern + lVar9 + 1);
        if (cVar4 != cVar8) break;
        if (iVar2 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 2);
        cVar8 = *(char *)((long)pPattern + lVar9 + 2);
        if (cVar4 != cVar8) break;
        if (iVar3 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 3);
        cVar8 = *(char *)((long)pPattern + lVar9 + 3);
        if (cVar4 != cVar8) break;
        lVar9 = lVar9 + 4;
        if (pLen == (sxu32)lVar9) goto LAB_00135496;
      }
      if (cVar4 == cVar8) goto LAB_00135496;
      pvVar10 = (void *)((long)pvVar6 + 1);
      if (pvVar5 < pvVar10) {
        return -6;
      }
      lVar9 = 0;
      while( true ) {
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 1);
        cVar8 = *(char *)((long)pPattern + lVar9);
        iVar7 = (int)lVar9;
        if (cVar4 != cVar8) break;
        if (iVar1 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 2);
        cVar8 = *(char *)((long)pPattern + lVar9 + 1);
        if (cVar4 != cVar8) break;
        if (iVar2 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 3);
        cVar8 = *(char *)((long)pPattern + lVar9 + 2);
        if (cVar4 != cVar8) break;
        if (iVar3 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 4);
        cVar8 = *(char *)((long)pPattern + lVar9 + 3);
        if (cVar4 != cVar8) break;
        lVar9 = lVar9 + 4;
        if (pLen == (sxu32)lVar9) goto LAB_00135496;
      }
      if (cVar4 == cVar8) goto LAB_00135496;
      pvVar10 = (void *)((long)pvVar6 + 2);
      if (pvVar5 < pvVar10) {
        return -6;
      }
      lVar9 = 0;
      while( true ) {
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 2);
        cVar8 = *(char *)((long)pPattern + lVar9);
        iVar7 = (int)lVar9;
        if (cVar4 != cVar8) break;
        if (iVar1 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 3);
        cVar8 = *(char *)((long)pPattern + lVar9 + 1);
        if (cVar4 != cVar8) break;
        if (iVar2 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 4);
        cVar8 = *(char *)((long)pPattern + lVar9 + 2);
        if (cVar4 != cVar8) break;
        if (iVar3 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 5);
        cVar8 = *(char *)((long)pPattern + lVar9 + 3);
        if (cVar4 != cVar8) break;
        lVar9 = lVar9 + 4;
        if (pLen == (sxu32)lVar9) goto LAB_00135496;
      }
      if (cVar4 == cVar8) goto LAB_00135496;
      pvVar10 = (void *)((long)pvVar6 + 3);
      if (pvVar5 < pvVar10) {
        return -6;
      }
      lVar9 = 0;
      while( true ) {
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 3);
        cVar8 = *(char *)((long)pPattern + lVar9);
        if (cVar4 != cVar8) break;
        iVar7 = (int)lVar9;
        if (iVar1 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 4);
        cVar8 = *(char *)((long)pPattern + lVar9 + 1);
        if (cVar4 != cVar8) break;
        if (iVar2 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 5);
        cVar8 = *(char *)((long)pPattern + lVar9 + 2);
        if (cVar4 != cVar8) break;
        if (iVar3 == iVar7) goto LAB_00135496;
        cVar4 = *(char *)((long)pvVar6 + lVar9 + 6);
        cVar8 = *(char *)((long)pPattern + lVar9 + 3);
        if (cVar4 != cVar8) break;
        lVar9 = lVar9 + 4;
        if (pLen == (sxu32)lVar9) goto LAB_00135496;
      }
      if (cVar4 == cVar8) goto LAB_00135496;
      pvVar6 = (void *)((long)pvVar6 + 4);
    } while (pvVar6 <= pvVar5);
  }
  return -6;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobSearch(const void *pBlob, sxu32 nLen, const void *pPattern, sxu32 pLen, sxu32 *pOfft)
{
	const char *zIn = (const char *)pBlob;
	const char *zEnd;
	sxi32 rc;
	if( pLen > nLen ){
		return SXERR_NOTFOUND;
	}
	zEnd = &zIn[nLen-pLen];
	for(;;){
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
	}
	return SXERR_NOTFOUND;
}